

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::SstReader::EndStep(SstReader *this)

{
  SstStream Stream;
  SstStatusValue SVar1;
  int iVar2;
  size_t UEffectiveTimestep;
  undefined8 uVar3;
  ScopedTimer __var2454;
  ScopedTimer local_b0;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if ((this->super_Engine).m_BetweenStepPairs == false) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Engine","");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"SstReader","");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"EndStep","");
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"EndStep() is called without a successful BeginStep()","");
    helper::Throw<std::logic_error>(&local_48,&local_68,&local_88,&local_a8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  (this->super_Engine).m_BetweenStepPairs = false;
  if (EndStep()::__var454 == '\0') {
    iVar2 = __cxa_guard_acquire(&EndStep()::__var454);
    if (iVar2 != 0) {
      uVar3 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/sst/SstReader.cpp"
                                  ,"virtual void adios2::core::engine::SstReader::EndStep()",0x1c6);
      EndStep::__var454 = (void *)ps_timer_create_(uVar3);
      __cxa_guard_release(&EndStep()::__var454);
    }
  }
  local_b0.m_timer = EndStep::__var454;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  if (((this->super_Engine).m_ReaderSelectionsLocked == true) &&
     (this->m_DefinitionsNotified == false)) {
    Stream = this->m_Input;
    UEffectiveTimestep = SstCurrentStep(Stream);
    SstReaderDefinitionLock(Stream,UEffectiveTimestep);
    this->m_DefinitionsNotified = true;
  }
  if (this->m_WriterMarshalMethod == SstMarshalBP) {
    (*(this->super_Engine)._vptr_Engine[7])(this);
    if (this->m_BP3Deserializer != (BP3Deserializer *)0x0) {
      (**(code **)(*(long *)this->m_BP3Deserializer + 8))();
    }
  }
  else if (this->m_WriterMarshalMethod == SstMarshalFFS) {
    SVar1 = SstFFSPerformGets(this->m_Input);
    if (SVar1 != SstSuccess) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Engine","");
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"SstReader","");
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"EndStep","");
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"Writer failed before returning data","");
      helper::Throw<std::runtime_error>(&local_48,&local_68,&local_88,&local_a8,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
  }
  if (this->m_WriterMarshalMethod == SstMarshalBP5) {
    BP5PerformGets(this);
  }
  SstReleaseStep(this->m_Input);
  std::
  _Hashtable<const_adios2::core::VariableBase_*,_std::pair<const_adios2::core::VariableBase_*const,_std::unique_ptr<adios2::MinVarInfo,_std::default_delete<adios2::MinVarInfo>_>_>,_std::allocator<std::pair<const_adios2::core::VariableBase_*const,_std::unique_ptr<adios2::MinVarInfo,_std::default_delete<adios2::MinVarInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_adios2::core::VariableBase_*>,_std::hash<const_adios2::core::VariableBase_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->m_InfoMap)._M_h);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_b0);
  return;
}

Assistant:

void SstReader::EndStep()
{
    if (!m_BetweenStepPairs)
    {
        helper::Throw<std::logic_error>("Engine", "SstReader", "EndStep",
                                        "EndStep() is called without a successful BeginStep()");
    }
    m_BetweenStepPairs = false;
    PERFSTUBS_SCOPED_TIMER_FUNC();
    if (m_ReaderSelectionsLocked && !m_DefinitionsNotified)
    {
        SstReaderDefinitionLock(m_Input, SstCurrentStep(m_Input));
        m_DefinitionsNotified = true;
    }
    if (m_WriterMarshalMethod == SstMarshalFFS)
    {
        SstStatusValue Result;
        // this does all the deferred gets and fills in the variable array data
        Result = SstFFSPerformGets(m_Input);
        if (Result != SstSuccess)
        {
            // tentative, until we change EndStep so that it has a return value
            helper::Throw<std::runtime_error>("Engine", "SstReader", "EndStep",
                                              "Writer failed before returning data");
        }
    }
    else if (m_WriterMarshalMethod == SstMarshalBP)
    {

        PerformGets();
        //  I'm assuming that the DoGet calls below have been constructing
        //  some kind of data structure that indicates what data this reader
        //  needs from different writers, what read requests it needs to
        //  make, where to put the data when it arrives, etc.  Therefore the
        //  pseudocode here looks like:
        //         IssueReadRequests()   I.E. do calls to SstReadRemoteMemory()
        //         as necessary to get the data coming these are asynchronous
        //	   so that they can happen in parallel.
        //         WaitForReadRequests()   Wait for each of these read requests
        //         to complete.  See the SstWaitForCompletion function.
        //         FillReadRequests()    Given the data that was just read,
        //         place it appropriately into the waiting vars.
        //	   ClearReadRequests()  Clean up as necessary
        //
        delete m_BP3Deserializer;
    }
    if (m_WriterMarshalMethod == SstMarshalBP5)
    {

        BP5PerformGets();
    }
    else
    {
        // unknown marshaling method, shouldn't happen
    }
    SstReleaseStep(m_Input);
    m_InfoMap.clear();
}